

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcore.cpp
# Opt level: O2

void rtcSetGeometryOccludedFunction(RTCGeometry hgeometry,RTCOccludedFunctionN occluded)

{
  undefined8 *puVar1;
  allocator local_49;
  DeviceEnterLeave enterleave;
  
  if (hgeometry != (RTCGeometry)0x0) {
    embree::DeviceEnterLeave::DeviceEnterLeave(&enterleave,hgeometry);
    (**(code **)(*(long *)hgeometry + 0x160))(hgeometry,occluded);
    embree::DeviceEnterLeave::~DeviceEnterLeave(&enterleave);
    return;
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string((string *)&enterleave,"invalid argument",&local_49);
  *puVar1 = &PTR__rtcore_error_021d38e0;
  *(undefined4 *)(puVar1 + 1) = 2;
  std::__cxx11::string::string((string *)(puVar1 + 2),(string *)&enterleave);
  __cxa_throw(puVar1,&embree::rtcore_error::typeinfo,embree::rtcore_error::~rtcore_error);
}

Assistant:

RTC_API void rtcSetGeometryOccludedFunction (RTCGeometry hgeometry, RTCOccludedFunctionN occluded) 
  {
    Geometry* geometry = (Geometry*) hgeometry;
    RTC_CATCH_BEGIN;
    RTC_TRACE(rtcSetOccludedFunctionN);
    RTC_VERIFY_HANDLE(hgeometry);
    RTC_ENTER_DEVICE(hgeometry);
    geometry->setOccludedFunctionN(occluded);
    RTC_CATCH_END2(geometry);
  }